

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocale::toString(QLocale *this,QDateTime *dateTime,FormatType format,QCalendar cal)

{
  QStringView format_00;
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  int in_ECX;
  QCalendar in_RDX;
  qsizetype in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString format_str;
  QVariant res;
  QVariant *in_stack_fffffffffffffef8;
  QVariant *in_stack_ffffffffffffff00;
  QVariant *in_stack_ffffffffffffff08;
  QString *str;
  QCalendar *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  QLocale *in_stack_ffffffffffffff30;
  FormatType format_01;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff54;
  qsizetype qVar5;
  QString *pQVar6;
  QString local_68;
  QLocale local_48 [4];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = in_RSI;
  pQVar6 = in_RDI;
  bVar1 = QDateTime::isValid((QDateTime *)in_stack_ffffffffffffff00);
  format_01 = (FormatType)((ulong)in_RSI >> 0x20);
  if (bVar1) {
    bVar1 = QCalendar::isGregorian(in_stack_ffffffffffffff10);
    if ((bVar1) &&
       (pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                           ((QSharedDataPointer<QLocalePrivate> *)0x4ce5ee),
       pQVar2->m_data == &systemLocaleData)) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = systemLocale();
      in_stack_ffffffffffffff2c = 0x18 - (in_ECX == 0);
      in_stack_ffffffffffffff30 = local_48;
      ::QVariant::QVariant(in_stack_ffffffffffffff00,(QDateTime *)in_stack_fffffffffffffef8);
      (*pQVar3->_vptr_QSystemLocale[2])
                (&local_28,pQVar3,(ulong)in_stack_ffffffffffffff2c,in_stack_ffffffffffffff30);
      ::QVariant::~QVariant(in_stack_ffffffffffffff00);
      bVar1 = ::QVariant::isNull(in_stack_ffffffffffffff08);
      if (!bVar1) {
        ::QVariant::toString(in_stack_fffffffffffffef8);
      }
      uVar4 = (uint)!bVar1;
      ::QVariant::~QVariant(in_stack_ffffffffffffff00);
      if (uVar4 != 0) goto LAB_004ce7f5;
      in_stack_ffffffffffffff50 = 0;
    }
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    str = &local_68;
    dateTimeFormat((QLocale *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   format_01);
    QStringView::QStringView<QString,_true>((QStringView *)in_RDX.d_ptr,str);
    format_00.m_data = (storage_type_conflict *)pQVar6;
    format_00.m_size = qVar5;
    toString(in_stack_ffffffffffffff30,
             (QDateTime *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),format_00,
             in_RDX);
    QString::~QString((QString *)0x4ce7d2);
  }
  else {
    QString::QString((QString *)0x4ce5c9);
  }
LAB_004ce7f5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::toString(const QDateTime &dateTime, FormatType format, QCalendar cal) const
{
    if (!dateTime.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (cal.isGregorian() && d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateTimeToStringLong
                                             : QSystemLocale::DateTimeToStringShort,
                                             dateTime);
        if (!res.isNull())
            return res.toString();
    }
#endif

    const QString format_str = dateTimeFormat(format);
    return toString(dateTime, format_str, cal);
}